

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O0

void do_predict(FILE *input,FILE *output)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  long lVar4;
  ushort **ppuVar5;
  double dVar6;
  int local_b8;
  int local_b4;
  int j_1;
  int inst_max_index;
  char *endptr;
  char *label;
  char *val;
  char *idx;
  double predict_label;
  double target_label;
  void *pvStack_78;
  int i;
  int *labels;
  int local_68;
  int nr_feature;
  int n;
  int j;
  double *prob_estimates;
  double dStack_50;
  int nr_class;
  double sumpt;
  double sumtt;
  double sumpp;
  double sumt;
  double sump;
  double error;
  int total;
  int correct;
  FILE *output_local;
  FILE *input_local;
  
  error._4_4_ = 0;
  error._0_4_ = 0;
  sump = 0.0;
  sumt = 0.0;
  sumpp = 0.0;
  sumtt = 0.0;
  sumpt = 0.0;
  dStack_50 = 0.0;
  _total = (FILE *)output;
  output_local = input;
  prob_estimates._4_4_ = get_nr_class(model_);
  _n = (void *)0x0;
  labels._4_4_ = get_nr_feature(model_);
  local_68 = labels._4_4_;
  if (0.0 <= model_->bias) {
    local_68 = labels._4_4_ + 1;
  }
  if (flag_predict_probability != 0) {
    iVar1 = check_probability_model(model_);
    if (iVar1 == 0) {
      fprintf(_stderr,"probability output is only supported for logistic regression\n");
      exit(1);
    }
    pvStack_78 = malloc((long)prob_estimates._4_4_ << 2);
    get_labels(model_,pvStack_78);
    _n = malloc((long)prob_estimates._4_4_ << 3);
    fprintf(_total,"labels");
    for (nr_feature = 0; nr_feature < prob_estimates._4_4_; nr_feature = nr_feature + 1) {
      fprintf(_total," %d",(ulong)*(uint *)((long)pvStack_78 + (long)nr_feature * 4));
    }
    fprintf(_total,"\n");
    free(pvStack_78);
  }
  max_line_len = 0x400;
  line = (char *)malloc(0x400);
  while (pcVar2 = readline(output_local), pcVar2 != (char *)0x0) {
    target_label._4_4_ = 0;
    local_b4 = 0;
    endptr = strtok(line," \t\n");
    if (endptr == (char *)0x0) {
      exit_input_error(error._0_4_ + 1);
    }
    predict_label = strtod(endptr,(char **)&j_1);
    if ((_j_1 == endptr) || (*_j_1 != '\0')) {
      exit_input_error(error._0_4_ + 1);
    }
    while( true ) {
      if (max_nr_attr + -2 <= target_label._4_4_) {
        max_nr_attr = max_nr_attr << 1;
        x = (feature_node *)realloc(x,(long)max_nr_attr << 4);
      }
      val = strtok((char *)0x0,":");
      label = strtok((char *)0x0," \t");
      if (label == (char *)0x0) break;
      piVar3 = __errno_location();
      *piVar3 = 0;
      lVar4 = strtol(val,(char **)&j_1,10);
      x[target_label._4_4_].index = (int)lVar4;
      if ((((_j_1 == val) || (piVar3 = __errno_location(), *piVar3 != 0)) || (*_j_1 != '\0')) ||
         (x[target_label._4_4_].index <= local_b4)) {
        exit_input_error(error._0_4_ + 1);
      }
      else {
        local_b4 = x[target_label._4_4_].index;
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
      dVar6 = strtod(label,(char **)&j_1);
      x[target_label._4_4_].value = dVar6;
      if (((_j_1 == label) || (piVar3 = __errno_location(), *piVar3 != 0)) ||
         ((*_j_1 != '\0' && (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*_j_1] & 0x2000) == 0)))) {
        exit_input_error(error._0_4_ + 1);
      }
      if (x[target_label._4_4_].index <= labels._4_4_) {
        target_label._4_4_ = target_label._4_4_ + 1;
      }
    }
    if (0.0 <= model_->bias) {
      x[target_label._4_4_].index = local_68;
      x[target_label._4_4_].value = model_->bias;
      target_label._4_4_ = target_label._4_4_ + 1;
    }
    x[target_label._4_4_].index = -1;
    if (flag_predict_probability == 0) {
      idx = (char *)predict(model_,x);
      fprintf(_total,"%g\n",idx);
    }
    else {
      idx = (char *)predict_probability(model_,x,_n);
      fprintf(_total,"%g",idx);
      for (local_b8 = 0; local_b8 < model_->nr_class; local_b8 = local_b8 + 1) {
        fprintf(_total," %g",*(undefined8 *)((long)_n + (long)local_b8 * 8));
      }
      fprintf(_total,"\n");
    }
    if (((double)idx == predict_label) && (!NAN((double)idx) && !NAN(predict_label))) {
      error._4_4_ = error._4_4_ + 1;
    }
    sump = ((double)idx - predict_label) * ((double)idx - predict_label) + sump;
    sumt = (double)idx + sumt;
    sumpp = predict_label + sumpp;
    sumtt = (double)idx * (double)idx + sumtt;
    sumpt = predict_label * predict_label + sumpt;
    dStack_50 = (double)idx * predict_label + dStack_50;
    error._0_4_ = error._0_4_ + 1;
  }
  iVar1 = check_regression_model(model_);
  if (iVar1 == 0) {
    (*info)("Accuracy = %g%% (%d/%d)\n",
            ((double)(int)error._4_4_ / (double)(int)error._0_4_) * 100.0,(ulong)error._4_4_,
            (ulong)error._0_4_);
  }
  else {
    (*info)("Mean squared error = %g (regression)\n",sump / (double)(int)error._0_4_);
    (*info)("Squared correlation coefficient = %g (regression)\n",
            (((double)(int)error._0_4_ * dStack_50 + -(sumt * sumpp)) *
            ((double)(int)error._0_4_ * dStack_50 + -(sumt * sumpp))) /
            (((double)(int)error._0_4_ * sumtt + -(sumt * sumt)) *
            ((double)(int)error._0_4_ * sumpt + -(sumpp * sumpp))));
  }
  if (flag_predict_probability != 0) {
    free(_n);
  }
  return;
}

Assistant:

void do_predict(FILE *input, FILE *output)
{
	int correct = 0;
	int total = 0;
	double error = 0;
	double sump = 0, sumt = 0, sumpp = 0, sumtt = 0, sumpt = 0;

	int nr_class=get_nr_class(model_);
	double *prob_estimates=NULL;
	int j, n;
	int nr_feature=get_nr_feature(model_);
	if(model_->bias>=0)
		n=nr_feature+1;
	else
		n=nr_feature;

	if(flag_predict_probability)
	{
		int *labels;

		if(!check_probability_model(model_))
		{
			fprintf(stderr, "probability output is only supported for logistic regression\n");
			exit(1);
		}

		labels=(int *) malloc(nr_class*sizeof(int));
		get_labels(model_,labels);
		prob_estimates = (double *) malloc(nr_class*sizeof(double));
		fprintf(output,"labels");
		for(j=0;j<nr_class;j++)
			fprintf(output," %d",labels[j]);
		fprintf(output,"\n");
		free(labels);
	}

	max_line_len = 1024;
	line = (char *)malloc(max_line_len*sizeof(char));
	while(readline(input) != NULL)
	{
		int i = 0;
		double target_label, predict_label;
		char *idx, *val, *label, *endptr;
		int inst_max_index = 0; // strtol gives 0 if wrong format

		label = strtok(line," \t\n");
		if(label == NULL) // empty line
			exit_input_error(total+1);

		target_label = strtod(label,&endptr);
		if(endptr == label || *endptr != '\0')
			exit_input_error(total+1);

		while(1)
		{
			if(i>=max_nr_attr-2)	// need one more for index = -1
			{
				max_nr_attr *= 2;
				x = (struct feature_node *) realloc(x,max_nr_attr*sizeof(struct feature_node));
			}

			idx = strtok(NULL,":");
			val = strtok(NULL," \t");

			if(val == NULL)
				break;
			errno = 0;
			x[i].index = (int) strtol(idx,&endptr,10);
			if(endptr == idx || errno != 0 || *endptr != '\0' || x[i].index <= inst_max_index)
				exit_input_error(total+1);
			else
				inst_max_index = x[i].index;

			errno = 0;
			x[i].value = strtod(val,&endptr);
			if(endptr == val || errno != 0 || (*endptr != '\0' && !isspace(*endptr)))
				exit_input_error(total+1);

			// feature indices larger than those in training are not used
			if(x[i].index <= nr_feature)
				++i;
		}

		if(model_->bias>=0)
		{
			x[i].index = n;
			x[i].value = model_->bias;
			i++;
		}
		x[i].index = -1;

		if(flag_predict_probability)
		{
			int j;
			predict_label = predict_probability(model_,x,prob_estimates);
			fprintf(output,"%g",predict_label);
			for(j=0;j<model_->nr_class;j++)
				fprintf(output," %g",prob_estimates[j]);
			fprintf(output,"\n");
		}
		else
		{
			predict_label = predict(model_,x);
			fprintf(output,"%g\n",predict_label);
		}

		if(predict_label == target_label)
			++correct;
		error += (predict_label-target_label)*(predict_label-target_label);
		sump += predict_label;
		sumt += target_label;
		sumpp += predict_label*predict_label;
		sumtt += target_label*target_label;
		sumpt += predict_label*target_label;
		++total;
	}
	if(check_regression_model(model_))
	{
		info("Mean squared error = %g (regression)\n",error/total);
		info("Squared correlation coefficient = %g (regression)\n",
			((total*sumpt-sump*sumt)*(total*sumpt-sump*sumt))/
			((total*sumpp-sump*sump)*(total*sumtt-sumt*sumt))
			);
	}
	else
		info("Accuracy = %g%% (%d/%d)\n",(double) correct/total*100,correct,total);
	if(flag_predict_probability)
		free(prob_estimates);
}